

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_1363e4::generateRandomFile
               (int channelCount,Compression compression,bool bulkWrite,bool relativeCoords,
               string *filename)

{
  PixelType PVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  ushort uVar6;
  char cVar7;
  int *piVar8;
  Array2D<void_*> *pAVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ostream *poVar17;
  string *psVar18;
  void *pvVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  void *pvVar24;
  char *pcVar25;
  uint uVar26;
  int i;
  int iVar27;
  PixelType PVar28;
  long lVar29;
  long lVar30;
  ulong size;
  char *pcVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  long lVar35;
  ulong uVar36;
  int j_2;
  uint32_t ui;
  float fVar37;
  long lVar38;
  long lVar39;
  float fVar40;
  int j;
  long local_2f0;
  imath_half_bits_t ret;
  Array<Imf_3_2::Array2D<void_*>_> data;
  DeepTiledOutputFile file;
  Box2i box;
  int type;
  undefined4 uStack_23c;
  long local_230 [2];
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (!bulkWrite || !relativeCoords) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ",0xb);
    std::ostream::flush();
    frameBuffer._map._M_t._M_impl._0_8_ = 0;
    Imf_3_2::Header::Header
              ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
               (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
               compression);
    Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
    Imf_3_2::Header::~Header((Header *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
    poVar17 = (ostream *)std::ostream::operator<<(&std::cout,compression);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    std::ostream::flush();
    if (DAT_001ef5e8._M_current != (anonymous_namespace)::channelTypes) {
      DAT_001ef5e8._M_current = (anonymous_namespace)::channelTypes;
    }
    if (0 < channelCount) {
      iVar27 = 0;
      do {
        type = random_int(3);
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1a8,iVar27);
        std::__cxx11::stringbuf::str();
        if (type == 0) {
          psVar18 = (string *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&box,UINT,1,1,false);
          Imf_3_2::ChannelList::insert(psVar18,(Channel *)&frameBuffer);
        }
        if (type == 1) {
          psVar18 = (string *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&box,HALF,1,1,false);
          Imf_3_2::ChannelList::insert(psVar18,(Channel *)&frameBuffer);
        }
        if (type == 2) {
          psVar18 = (string *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&box,FLOAT,1,1,false);
          Imf_3_2::ChannelList::insert(psVar18,(Channel *)&frameBuffer);
        }
        if (DAT_001ef5e8._M_current == DAT_001ef5f0) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                     DAT_001ef5e8,&type);
        }
        else {
          *DAT_001ef5e8._M_current = type;
          DAT_001ef5e8._M_current = DAT_001ef5e8._M_current + 1;
        }
        if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
            &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                          (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent)->_M_color + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        iVar27 = iVar27 + 1;
      } while (channelCount != iVar27);
    }
    Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
    iVar27 = random_int(0x111);
    iVar10 = random_int(0xa9);
    iVar10 = iVar10 + 1;
    _ss = iVar27 + 1;
    Imf_3_2::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
    remove((filename->_M_dataplus)._M_p);
    Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
              (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
    size = (ulong)(uint)channelCount;
    Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,size);
    if (0 < channelCount) {
      lVar38 = 0;
      do {
        pAVar9 = data._data;
        pvVar19 = operator_new__(0x5a1c8);
        pvVar20 = *(void **)((long)&pAVar9->_data + lVar38);
        if (pvVar20 != (void *)0x0) {
          operator_delete__(pvVar20);
        }
        *(undefined8 *)((long)&pAVar9->_sizeX + lVar38) = 0xa9;
        *(undefined8 *)((long)&pAVar9->_sizeY + lVar38) = 0x111;
        *(void **)((long)&pAVar9->_data + lVar38) = pvVar19;
        lVar38 = lVar38 + 0x18;
      } while (size * 0x18 != lVar38);
    }
    pvVar20 = operator_new__(0x2d0e4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," tileSizeX ",0xb);
    Imf_3_2::DeepTiledOutputFile::tileXSize();
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," tileSizeY ",0xb);
    Imf_3_2::DeepTiledOutputFile::tileYSize();
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
    iVar27 = Imf_3_2::DeepTiledOutputFile::numYLevels();
    iVar11 = Imf_3_2::DeepTiledOutputFile::numXLevels();
    lVar38 = (long)iVar27;
    lVar39 = (long)iVar11;
    uVar36 = lVar39 * lVar38;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar36;
    uVar21 = SUB168(auVar4 * ZEXT816(0x18),0);
    uVar22 = uVar21 + 8;
    if (0xfffffffffffffff7 < uVar21) {
      uVar22 = 0xffffffffffffffff;
    }
    uVar21 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar21 = uVar22;
    }
    puVar23 = (ulong *)operator_new__(uVar21);
    *puVar23 = uVar36;
    puVar23 = puVar23 + 1;
    if (uVar36 != 0) {
      memset(puVar23,0,((uVar36 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    if (DAT_001ef608 != (ulong *)0x0) {
      lVar35 = *(long *)((long)DAT_001ef608 + -8);
      pvVar19 = (void *)((long)DAT_001ef608 + -8);
      if (lVar35 != 0) {
        lVar29 = lVar35 * 0x18;
        do {
          pvVar24 = *(void **)((long)pvVar19 + lVar29);
          if (pvVar24 != (void *)0x0) {
            operator_delete__(pvVar24);
          }
          lVar29 = lVar29 + -0x18;
        } while (lVar29 != 0);
      }
      operator_delete__(pvVar19,lVar35 * 0x18 + 8);
    }
    (anonymous_namespace)::sampleCountWhole = lVar38;
    DAT_001ef600 = lVar39;
    DAT_001ef608 = puVar23;
    if (0 < iVar27) {
      lVar39 = 0;
      lVar38 = 0;
      do {
        if (0 < DAT_001ef600) {
          lVar35 = 0x10;
          lVar29 = 0;
          do {
            puVar23 = DAT_001ef608;
            lVar30 = DAT_001ef600;
            pvVar24 = operator_new__(0x2d0e4);
            lVar30 = lVar30 * lVar39;
            pvVar19 = *(void **)((long)puVar23 + lVar35 + lVar30);
            if (pvVar19 != (void *)0x0) {
              operator_delete__(pvVar19);
            }
            *(undefined8 *)((long)puVar23 + lVar35 + lVar30 + -0x10) = 0xa9;
            *(undefined8 *)((long)puVar23 + lVar35 + -8 + lVar30) = 0x111;
            *(void **)((long)puVar23 + lVar35 + lVar30) = pvVar24;
            lVar29 = lVar29 + 1;
            lVar35 = lVar35 + 0x18;
          } while (lVar29 < DAT_001ef600);
        }
        lVar38 = lVar38 + 1;
        lVar39 = lVar39 + 0x18;
      } while (lVar38 < (anonymous_namespace)::sampleCountWhole);
    }
    if (relativeCoords) {
      lVar38 = 0;
    }
    else {
      lVar38 = (long)DAT_001ef5c4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
    }
    Imf_3_2::Slice::Slice
              ((Slice *)&ss,UINT,(char *)((long)pvVar20 + lVar38 * -4),4,0x444,1,1,0.0,
               relativeCoords,relativeCoords);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
    if (0 < channelCount) {
      lVar39 = 0x10;
      uVar21 = 0;
      do {
        PVar1 = (anonymous_namespace)::channelTypes[uVar21];
        PVar28 = (uint)(PVar1 != UINT) * 3;
        if (PVar1 == HALF) {
          PVar28 = PVar1;
        }
        if (PVar1 == FLOAT) {
          PVar28 = PVar1;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1a8,(int)uVar21);
        std::__cxx11::stringbuf::str();
        iVar27 = (anonymous_namespace)::channelTypes[uVar21];
        uVar22 = (ulong)(iVar27 == 0) << 2;
        if (iVar27 == 1) {
          uVar22 = 2;
        }
        if (iVar27 == 2) {
          uVar22 = 4;
        }
        Imf_3_2::DeepSlice::DeepSlice
                  ((DeepSlice *)&box,PVar28,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar39) + lVar38 * -8),8,0x888,
                   uVar22,1,1,0.0,relativeCoords,relativeCoords);
        Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
        if ((long *)CONCAT44(uStack_23c,type) != local_230) {
          operator_delete((long *)CONCAT44(uStack_23c,type),local_230[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        uVar21 = uVar21 + 1;
        lVar39 = lVar39 + 0x18;
      } while (size != uVar21);
    }
    Imf_3_2::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
    std::ostream::flush();
    pcVar25 = "per-tile ";
    if (relativeCoords) {
      pcVar25 = "per-tile with relative coordinates ";
    }
    lVar38 = 9;
    if (relativeCoords) {
      lVar38 = 0x23;
    }
    pcVar31 = "bulk ";
    if (!bulkWrite) {
      pcVar31 = pcVar25;
    }
    lVar39 = 5;
    if (!bulkWrite) {
      lVar39 = lVar38;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar31,lVar39);
    std::ostream::flush();
    local_2f0 = 0;
    while( true ) {
      iVar27 = Imf_3_2::DeepTiledOutputFile::numYLevels();
      if (iVar27 <= local_2f0) break;
      lVar38 = 0;
      while( true ) {
        iVar27 = Imf_3_2::DeepTiledOutputFile::numXLevels();
        if (iVar27 <= lVar38) break;
        Imf_3_2::DeepTiledOutputFile::dataWindowForLevel((int)&ss,(int)&file);
        iVar27 = (int)lVar38;
        if (bulkWrite) {
          j = 0;
          while( true ) {
            iVar12 = (int)&file;
            iVar11 = Imf_3_2::DeepTiledOutputFile::numYTiles(iVar12);
            if (iVar11 <= j) break;
            iVar11 = 0;
            while( true ) {
              iVar12 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file);
              if (iVar12 <= iVar11) break;
              Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar11,j);
              iVar12 = box.min.y;
              if (box.min.y <= box.max.y) {
                do {
                  iVar16 = box.min.x;
                  if (box.min.x <= box.max.x) {
                    do {
                      lVar35 = (long)_ss;
                      iVar13 = random_int(10);
                      lVar39 = (long)iVar12 - (long)iVar10;
                      lVar35 = iVar16 - lVar35;
                      *(int *)((long)pvVar20 + lVar35 * 4 + lVar39 * 0x444) = iVar13 + 1;
                      *(int *)(DAT_001ef608[DAT_001ef600 * local_2f0 * 3 + lVar38 * 3 + 1] * lVar39
                               * 4 + DAT_001ef608[DAT_001ef600 * local_2f0 * 3 + lVar38 * 3 + 2] +
                              lVar35 * 4) = iVar13 + 1;
                      if (0 < channelCount) {
                        iVar13 = ((int)lVar39 * 0x111 + (int)lVar35) % 0x801;
                        fVar40 = (float)iVar13;
                        fVar37 = ABS(fVar40);
                        uVar26 = (uint)fVar40 & 0x7fffff | 0x800000;
                        cVar7 = (char)((uint)fVar40 >> 0x17);
                        uVar34 = (ushort)((uint)fVar40 >> 0x10) & 0x8000;
                        uVar14 = (uint)fVar40 >> 0xd & 0x3ff;
                        uVar5 = uVar34 + 0x7c00;
                        if ((uint)fVar37 < 0x477ff000) {
                          uVar5 = (ushort)((int)fVar37 + 0x8000fff +
                                           (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd) | uVar34;
                        }
                        uVar6 = (ushort)(uVar14 == 0) | (ushort)uVar14;
                        if (fVar37 == INFINITY) {
                          uVar6 = 0;
                        }
                        uVar21 = 0;
                        do {
                          if ((anonymous_namespace)::channelTypes[uVar21] == 0) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar35 * 4 + lVar39 * 0x444) <<
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar39 + lVar35] =
                                 pvVar19;
                          }
                          if ((anonymous_namespace)::channelTypes[uVar21] == 1) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar35 * 4 + lVar39 * 0x444) *
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar39 + lVar35] =
                                 pvVar19;
                          }
                          if ((anonymous_namespace)::channelTypes[uVar21] == 2) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar35 * 4 + lVar39 * 0x444) <<
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar39 + lVar35] =
                                 pvVar19;
                          }
                          piVar8 = (anonymous_namespace)::channelTypes;
                          if (*(int *)((long)pvVar20 + lVar35 * 4 + lVar39 * 0x444) != 0) {
                            uVar22 = 0;
                            do {
                              if (piVar8[uVar21] == 0) {
                                *(int *)((long)data._data[uVar21]._data
                                               [data._data[uVar21]._sizeY * lVar39 + lVar35] +
                                        uVar22 * 4) = iVar13;
                              }
                              iVar15 = piVar8[uVar21];
                              if (iVar15 == 2) {
                                *(float *)((long)data._data[uVar21]._data
                                                 [data._data[uVar21]._sizeY * lVar39 + lVar35] +
                                          uVar22 * 4) = fVar40;
                              }
                              else if (iVar15 == 1) {
                                uVar32 = uVar5;
                                if (0x7f7fffff < (uint)fVar37) {
                                  uVar32 = uVar34 + uVar6 + 0x7c00;
                                }
                                uVar33 = (ushort)(0x80000000 < uVar26 << (cVar7 + 0xa2U & 0x1f)) +
                                         ((ushort)(uVar26 >> (0x7eU - cVar7 & 0x1f)) | uVar34);
                                if ((uint)fVar37 < 0x33000001) {
                                  uVar33 = uVar34;
                                }
                                if (0x387fffff < (uint)fVar37) {
                                  uVar33 = uVar32;
                                }
                                *(ushort *)
                                 ((long)data._data[uVar21]._data
                                        [data._data[uVar21]._sizeY * lVar39 + lVar35] + uVar22 * 2)
                                     = uVar33;
                              }
                              uVar22 = uVar22 + 1;
                            } while (uVar22 < *(uint *)((long)pvVar20 + lVar35 * 4 + lVar39 * 0x444)
                                    );
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar21 != size);
                      }
                      bVar3 = iVar16 < box.max.x;
                      iVar16 = iVar16 + 1;
                    } while (bVar3);
                  }
                  bVar3 = iVar12 < box.max.y;
                  iVar12 = iVar12 + 1;
                } while (bVar3);
              }
              iVar11 = iVar11 + 1;
            }
            j = j + 1;
          }
          iVar11 = Imf_3_2::DeepTiledOutputFile::numXTiles(iVar12);
          iVar16 = Imf_3_2::DeepTiledOutputFile::numYTiles(iVar12);
          Imf_3_2::DeepTiledOutputFile::writeTiles(iVar12,0,iVar11 + -1,0,iVar16 + -1,iVar27);
        }
        else if (relativeCoords) {
          j = 0;
          while( true ) {
            iVar11 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file);
            if (iVar11 <= j) break;
            iVar11 = 0;
            while( true ) {
              iVar12 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file);
              if (iVar12 <= iVar11) break;
              Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar11,j);
              iVar12 = box.min.y;
              if (box.min.y <= box.max.y) {
                do {
                  iVar16 = box.min.x;
                  if (box.min.x <= box.max.x) {
                    do {
                      lVar35 = (long)_ss;
                      lVar30 = (long)box.min.y;
                      lVar29 = (long)box.min.x;
                      iVar13 = random_int(10);
                      lVar39 = (long)iVar12 - (long)iVar10;
                      lVar35 = iVar16 - lVar35;
                      lVar29 = iVar16 - lVar29;
                      lVar30 = iVar12 - lVar30;
                      *(int *)((long)pvVar20 + lVar29 * 4 + lVar30 * 0x444) = iVar13 + 1;
                      *(int *)(DAT_001ef608[DAT_001ef600 * local_2f0 * 3 + lVar38 * 3 + 1] * lVar39
                               * 4 + DAT_001ef608[DAT_001ef600 * local_2f0 * 3 + lVar38 * 3 + 2] +
                              lVar35 * 4) = iVar13 + 1;
                      if (0 < channelCount) {
                        iVar13 = ((int)lVar39 * 0x111 + (int)lVar35) % 0x801;
                        fVar40 = (float)iVar13;
                        fVar37 = ABS(fVar40);
                        uVar26 = (uint)fVar40 & 0x7fffff | 0x800000;
                        cVar7 = (char)((uint)fVar40 >> 0x17);
                        uVar34 = (ushort)((uint)fVar40 >> 0x10) & 0x8000;
                        uVar14 = (uint)fVar40 >> 0xd & 0x3ff;
                        uVar5 = uVar34 + 0x7c00;
                        if ((uint)fVar37 < 0x477ff000) {
                          uVar5 = (ushort)((int)fVar37 + 0x8000fff +
                                           (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd) | uVar34;
                        }
                        uVar6 = (ushort)(uVar14 == 0) | (ushort)uVar14;
                        if (fVar37 == INFINITY) {
                          uVar6 = 0;
                        }
                        uVar21 = 0;
                        do {
                          if ((anonymous_namespace)::channelTypes[uVar21] == 0) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar29 * 4 + lVar30 * 0x444) <<
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar30 + lVar29] =
                                 pvVar19;
                          }
                          if ((anonymous_namespace)::channelTypes[uVar21] == 1) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar29 * 4 + lVar30 * 0x444) *
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar30 + lVar29] =
                                 pvVar19;
                          }
                          if ((anonymous_namespace)::channelTypes[uVar21] == 2) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar29 * 4 + lVar30 * 0x444) <<
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar30 + lVar29] =
                                 pvVar19;
                          }
                          piVar8 = (anonymous_namespace)::channelTypes;
                          if (*(int *)((long)pvVar20 + lVar29 * 4 + lVar30 * 0x444) != 0) {
                            uVar22 = 0;
                            do {
                              if (piVar8[uVar21] == 0) {
                                *(int *)((long)data._data[uVar21]._data
                                               [data._data[uVar21]._sizeY * lVar30 + lVar29] +
                                        uVar22 * 4) = iVar13;
                              }
                              iVar15 = piVar8[uVar21];
                              if (iVar15 == 2) {
                                *(float *)((long)data._data[uVar21]._data
                                                 [data._data[uVar21]._sizeY * lVar30 + lVar29] +
                                          uVar22 * 4) = fVar40;
                              }
                              else if (iVar15 == 1) {
                                uVar32 = uVar5;
                                if (0x7f7fffff < (uint)fVar37) {
                                  uVar32 = uVar34 + uVar6 + 0x7c00;
                                }
                                uVar33 = (ushort)(0x80000000 < uVar26 << (cVar7 + 0xa2U & 0x1f)) +
                                         ((ushort)(uVar26 >> (0x7eU - cVar7 & 0x1f)) | uVar34);
                                if ((uint)fVar37 < 0x33000001) {
                                  uVar33 = uVar34;
                                }
                                if (0x387fffff < (uint)fVar37) {
                                  uVar33 = uVar32;
                                }
                                *(ushort *)
                                 ((long)data._data[uVar21]._data
                                        [data._data[uVar21]._sizeY * lVar30 + lVar29] + uVar22 * 2)
                                     = uVar33;
                              }
                              uVar22 = uVar22 + 1;
                            } while (uVar22 < *(uint *)((long)pvVar20 + lVar29 * 4 + lVar30 * 0x444)
                                    );
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar21 != size);
                      }
                      bVar3 = iVar16 < box.max.x;
                      iVar16 = iVar16 + 1;
                    } while (bVar3);
                  }
                  bVar3 = iVar12 < box.max.y;
                  iVar12 = iVar12 + 1;
                } while (bVar3);
              }
              Imf_3_2::DeepTiledOutputFile::writeTile((int)&file,iVar11,j,iVar27);
              iVar12 = box.min.y;
              if (box.min.y <= box.max.y) {
                do {
                  iVar16 = box.min.x;
                  if (box.min.x <= box.max.x) {
                    do {
                      if (0 < channelCount) {
                        lVar39 = 4;
                        uVar21 = 0;
                        do {
                          lVar35 = (long)box.min.y;
                          lVar29 = (long)box.min.x;
                          if (((anonymous_namespace)::channelTypes[uVar21] == 0) &&
                             (pvVar19 = *(void **)(*(long *)((long)data._data + lVar39 * 4 + -8) *
                                                   (iVar12 - lVar35) * 8 +
                                                   *(long *)((long)&(data._data)->_sizeX +
                                                            lVar39 * 4) + (iVar16 - lVar29) * 8),
                             pvVar19 != (void *)0x0)) {
                            operator_delete__(pvVar19);
                          }
                          iVar13 = (int)(iVar12 - lVar35);
                          iVar15 = (int)(iVar16 - lVar29);
                          if (((anonymous_namespace)::channelTypes[uVar21] == 1) &&
                             (pvVar19 = *(void **)((long)iVar13 *
                                                   *(long *)((long)data._data + lVar39 * 4 + -8) * 8
                                                   + *(long *)((long)&(data._data)->_sizeX +
                                                              lVar39 * 4) + (long)iVar15 * 8),
                             pvVar19 != (void *)0x0)) {
                            operator_delete__(pvVar19);
                          }
                          if (((anonymous_namespace)::channelTypes[uVar21] == 2) &&
                             (pvVar19 = *(void **)((long)iVar13 *
                                                   *(long *)((long)data._data + lVar39 * 4 + -8) * 8
                                                   + *(long *)((long)&(data._data)->_sizeX +
                                                              lVar39 * 4) + (long)iVar15 * 8),
                             pvVar19 != (void *)0x0)) {
                            operator_delete__(pvVar19);
                          }
                          uVar21 = uVar21 + 1;
                          lVar39 = lVar39 + 6;
                        } while (size != uVar21);
                      }
                      bVar3 = iVar16 < box.max.x;
                      iVar16 = iVar16 + 1;
                    } while (bVar3);
                  }
                  bVar3 = iVar12 < box.max.y;
                  iVar12 = iVar12 + 1;
                } while (bVar3);
              }
              iVar11 = iVar11 + 1;
            }
            j = j + 1;
          }
        }
        else {
          iVar11 = 0;
          while( true ) {
            iVar12 = Imf_3_2::DeepTiledOutputFile::numYTiles((int)&file);
            if (iVar12 <= iVar11) break;
            iVar12 = 0;
            while( true ) {
              iVar16 = Imf_3_2::DeepTiledOutputFile::numXTiles((int)&file);
              if (iVar16 <= iVar12) break;
              Imf_3_2::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar12,iVar11);
              iVar16 = box.min.y;
              if (box.min.y <= box.max.y) {
                do {
                  iVar13 = box.min.x;
                  if (box.min.x <= box.max.x) {
                    do {
                      lVar35 = (long)_ss;
                      iVar15 = random_int(10);
                      lVar39 = (long)iVar16 - (long)iVar10;
                      lVar35 = iVar13 - lVar35;
                      *(int *)((long)pvVar20 + lVar35 * 4 + lVar39 * 0x444) = iVar15 + 1;
                      *(int *)(DAT_001ef608[DAT_001ef600 * local_2f0 * 3 + lVar38 * 3 + 1] * lVar39
                               * 4 + DAT_001ef608[DAT_001ef600 * local_2f0 * 3 + lVar38 * 3 + 2] +
                              lVar35 * 4) = iVar15 + 1;
                      if (0 < channelCount) {
                        iVar15 = ((int)lVar39 * 0x111 + (int)lVar35) % 0x801;
                        fVar40 = (float)iVar15;
                        fVar37 = ABS(fVar40);
                        uVar26 = (uint)fVar40 & 0x7fffff | 0x800000;
                        cVar7 = (char)((uint)fVar40 >> 0x17);
                        uVar34 = (ushort)((uint)fVar40 >> 0x10) & 0x8000;
                        uVar14 = (uint)fVar40 >> 0xd & 0x3ff;
                        uVar5 = uVar34 + 0x7c00;
                        if ((uint)fVar37 < 0x477ff000) {
                          uVar5 = (ushort)((int)fVar37 + 0x8000fff +
                                           (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd) | uVar34;
                        }
                        uVar6 = (ushort)(uVar14 == 0) | (ushort)uVar14;
                        if (fVar37 == INFINITY) {
                          uVar6 = 0;
                        }
                        uVar21 = 0;
                        do {
                          if ((anonymous_namespace)::channelTypes[uVar21] == 0) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar35 * 4 + lVar39 * 0x444) <<
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar39 + lVar35] =
                                 pvVar19;
                          }
                          if ((anonymous_namespace)::channelTypes[uVar21] == 1) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar35 * 4 + lVar39 * 0x444) *
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar39 + lVar35] =
                                 pvVar19;
                          }
                          if ((anonymous_namespace)::channelTypes[uVar21] == 2) {
                            pvVar19 = operator_new__((ulong)*(uint *)((long)pvVar20 +
                                                                     lVar35 * 4 + lVar39 * 0x444) <<
                                                     2);
                            data._data[uVar21]._data[data._data[uVar21]._sizeY * lVar39 + lVar35] =
                                 pvVar19;
                          }
                          piVar8 = (anonymous_namespace)::channelTypes;
                          if (*(int *)((long)pvVar20 + lVar35 * 4 + lVar39 * 0x444) != 0) {
                            uVar22 = 0;
                            do {
                              if (piVar8[uVar21] == 0) {
                                *(int *)((long)data._data[uVar21]._data
                                               [data._data[uVar21]._sizeY * lVar39 + lVar35] +
                                        uVar22 * 4) = iVar15;
                              }
                              iVar2 = piVar8[uVar21];
                              if (iVar2 == 2) {
                                *(float *)((long)data._data[uVar21]._data
                                                 [data._data[uVar21]._sizeY * lVar39 + lVar35] +
                                          uVar22 * 4) = fVar40;
                              }
                              else if (iVar2 == 1) {
                                uVar32 = uVar5;
                                if (0x7f7fffff < (uint)fVar37) {
                                  uVar32 = uVar34 + uVar6 + 0x7c00;
                                }
                                uVar33 = (ushort)(0x80000000 < uVar26 << (cVar7 + 0xa2U & 0x1f)) +
                                         ((ushort)(uVar26 >> (0x7eU - cVar7 & 0x1f)) | uVar34);
                                if ((uint)fVar37 < 0x33000001) {
                                  uVar33 = uVar34;
                                }
                                if (0x387fffff < (uint)fVar37) {
                                  uVar33 = uVar32;
                                }
                                *(ushort *)
                                 ((long)data._data[uVar21]._data
                                        [data._data[uVar21]._sizeY * lVar39 + lVar35] + uVar22 * 2)
                                     = uVar33;
                              }
                              uVar22 = uVar22 + 1;
                            } while (uVar22 < *(uint *)((long)pvVar20 + lVar35 * 4 + lVar39 * 0x444)
                                    );
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar21 != size);
                      }
                      bVar3 = iVar13 < box.max.x;
                      iVar13 = iVar13 + 1;
                    } while (bVar3);
                  }
                  bVar3 = iVar16 < box.max.y;
                  iVar16 = iVar16 + 1;
                } while (bVar3);
              }
              Imf_3_2::DeepTiledOutputFile::writeTile((int)&file,iVar12,iVar11,iVar27);
              iVar12 = iVar12 + 1;
            }
            iVar11 = iVar11 + 1;
          }
        }
        if (!relativeCoords) {
          lVar39 = 0;
          while( true ) {
            iVar27 = Imf_3_2::DeepTiledOutputFile::levelHeight((int)&file);
            if (iVar27 <= lVar39) break;
            lVar35 = 0;
            while( true ) {
              iVar27 = Imf_3_2::DeepTiledOutputFile::levelWidth((int)&file);
              if (iVar27 <= lVar35) break;
              if (0 < channelCount) {
                lVar29 = 4;
                uVar21 = 0;
                do {
                  if (((anonymous_namespace)::channelTypes[uVar21] == 0) &&
                     (pvVar19 = *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar39 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) +
                                          lVar35 * 8), pvVar19 != (void *)0x0)) {
                    operator_delete__(pvVar19);
                  }
                  if (((anonymous_namespace)::channelTypes[uVar21] == 1) &&
                     (pvVar19 = *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar39 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) +
                                          lVar35 * 8), pvVar19 != (void *)0x0)) {
                    operator_delete__(pvVar19);
                  }
                  if (((anonymous_namespace)::channelTypes[uVar21] == 2) &&
                     (pvVar19 = *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar39 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) +
                                          lVar35 * 8), pvVar19 != (void *)0x0)) {
                    operator_delete__(pvVar19);
                  }
                  uVar21 = uVar21 + 1;
                  lVar29 = lVar29 + 6;
                } while (size != uVar21);
              }
              lVar35 = lVar35 + 1;
            }
            lVar39 = lVar39 + 1;
          }
        }
        lVar38 = lVar38 + 1;
      }
      local_2f0 = local_2f0 + 1;
    }
    operator_delete__(pvVar20);
    Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                 *)&frameBuffer);
    Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
    return;
  }
  __assert_fail("bulkWrite == false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                ,0x3c,
                "void (anonymous namespace)::generateRandomFile(int, Compression, bool, bool, const std::string &)"
               );
}

Assistant:

void
generateRandomFile (
    int                channelCount,
    Compression        compression,
    bool               bulkWrite,
    bool               relativeCoords,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkWrite == false);

    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);
    cout << "compression " << compression << " " << flush;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        random_int (width) + 1, random_int (height) + 1, RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    cout << " tileSizeX " << file.tileXSize () << " tileSizeY "
         << file.tileYSize () << " ";

    sampleCountWhole.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountWhole.height (); i++)
        for (int j = 0; j < sampleCountWhole.width (); j++)
            sampleCountWhole[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    cout << "writing " << flush;

    if (bulkWrite)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkWrite)
            {
                //
                // Bulk write (without relative coordinates).
                //

                for (int j = 0; j < file.numYTiles (ly); j++)
                {
                    for (int i = 0; i < file.numXTiles (lx); i++)
                    {
                        Box2i box = file.dataWindowForTile (i, j, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy               = y - dataWindowL.min.y;
                                int dwx               = x - dataWindowL.min.x;
                                sampleCount[dwy][dwx] = random_int (10) + 1;
                                sampleCountWhole[ly][lx][dwy][dwx] =
                                    sampleCount[dwy][dwx];
                                for (int k = 0; k < channelCount; k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] =
                                            new unsigned int[sampleCount[dwy]
                                                                        [dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[sampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[sampleCount[dwy][dwx]];
                                    for (unsigned int l = 0;
                                         l < sampleCount[dwy][dwx];
                                         l++)
                                    {
                                        if (channelTypes[k] == 0)
                                            ((unsigned int*)
                                                 data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 1)
                                            ((half*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                        if (channelTypes[k] == 2)
                                            ((float*) data[k][dwy][dwx])[l] =
                                                (dwy * width + dwx) % 2049;
                                    }
                                }
                            }
                    }
                }

                file.writeTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkWrite == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Per-tile write without relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    sampleCount[dwy][dwx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[dwy][dwx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[sampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] =
                                                new float[sampleCount[dwy]
                                                                     [dwx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[dwy][dwx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*)
                                                     data[k][dwy][dwx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Per-tile write with relative coordinates.
                    //

                    for (int j = 0; j < file.numYTiles (ly); j++)
                    {
                        for (int i = 0; i < file.numXTiles (lx); i++)
                        {
                            Box2i box = file.dataWindowForTile (i, j, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy             = y - dataWindowL.min.y;
                                    int dwx             = x - dataWindowL.min.x;
                                    int ty              = y - box.min.y;
                                    int tx              = x - box.min.x;
                                    sampleCount[ty][tx] = random_int (10) + 1;
                                    sampleCountWhole[ly][lx][dwy][dwx] =
                                        sampleCount[ty][tx];
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][ty][tx] = new unsigned int
                                                [sampleCount[ty][tx]];
                                        if (channelTypes[k] == 1)
                                            data[k][ty][tx] =
                                                new half[sampleCount[ty][tx]];
                                        if (channelTypes[k] == 2)
                                            data[k][ty][tx] =
                                                new float[sampleCount[ty][tx]];
                                        for (unsigned int l = 0;
                                             l < sampleCount[ty][tx];
                                             l++)
                                        {
                                            if (channelTypes[k] == 0)
                                                ((unsigned int*)
                                                     data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 1)
                                                ((half*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                            if (channelTypes[k] == 2)
                                                ((float*) data[k][ty][tx])[l] =
                                                    (dwy * width + dwx) % 2049;
                                        }
                                    }
                                }
                            file.writeTile (i, j, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                    for (int k = 0; k < channelCount; k++)
                                    {
                                        int ty = y - box.min.y;
                                        int tx = x - box.min.x;
                                        if (channelTypes[k] == 0)
                                            delete[](unsigned int*)
                                                data[k][ty][tx];
                                        if (channelTypes[k] == 1)
                                            delete[](half*) data[k][ty][tx];
                                        if (channelTypes[k] == 2)
                                            delete[](float*) data[k][ty][tx];
                                    }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[](unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[](half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[](float*) data[k][i][j];
                        }
            }
        }
}